

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_set_update4_info(Integer g_a)

{
  short sVar1;
  short sVar2;
  Integer *pIVar3;
  logical lVar4;
  Integer *width_00;
  double *pdVar5;
  size_t sVar6;
  long lVar7;
  Integer IVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_RDI;
  int _d_19;
  int _d_18;
  int _i_21;
  int _ndim_19;
  int _i_20;
  int _itmp_7;
  int _offset_7;
  int _ndim_18;
  int _i_19;
  int _index_15 [7];
  int _ndim_17;
  int _i_18;
  int _itmp_6;
  int _ndim_16;
  int _i_17;
  int _index_14 [7];
  int _ndim_15;
  int _i_16;
  Integer _dimpos_7;
  Integer _dimstart_7;
  Integer _dim_7;
  Integer _index_13;
  Integer _d_17;
  Integer _nb_7;
  Integer _loc_7;
  Integer _dimpos_6;
  Integer _dimstart_6;
  Integer _dim_6;
  Integer _index_12;
  Integer _d_16;
  Integer _nb_6;
  Integer _loc_6;
  Integer _hi_3 [7];
  Integer _lo_3 [7];
  Integer _offset_6;
  Integer _last_3;
  Integer _factor_3;
  Integer _d_15;
  int _ndim_14;
  int _i_15;
  int _itmp_5;
  int _offset_5;
  int _ndim_13;
  int _i_14;
  int _index_11 [7];
  int _ndim_12;
  int _i_13;
  int _itmp_4;
  int _ndim_11;
  int _i_12;
  int _index_10 [7];
  int _ndim_10;
  int _i_11;
  Integer _dimpos_5;
  Integer _dimstart_5;
  Integer _dim_5;
  Integer _index_9;
  Integer _d_14;
  Integer _nb_5;
  Integer _loc_5;
  Integer _dimpos_4;
  Integer _dimstart_4;
  Integer _dim_4;
  Integer _index_8;
  Integer _d_13;
  Integer _nb_4;
  Integer _loc_4;
  Integer _hi_2 [7];
  Integer _lo_2 [7];
  Integer _offset_4;
  Integer _last_2;
  Integer _factor_2;
  Integer _d_12;
  char err_string_3 [256];
  char *str_3;
  int _l_3;
  int _d_11;
  char err_string_2 [256];
  char *str_2;
  int _l_2;
  int _d_10;
  int _d_9;
  int _d_8;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_7;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_6;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_5;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_4;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_3;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_2;
  char err_string_1 [256];
  char *str_1;
  int _l_1;
  int _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  char *current;
  char *cache;
  char **ptr_rcv;
  char **ptr_snd;
  int cache_size;
  int *count;
  int *stride_rcv;
  int *stride_snd;
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer plo_rcv [7];
  Integer shi_rcv [7];
  Integer slo_rcv [7];
  Integer hi_rcv [7];
  Integer lo_rcv [7];
  Integer phi_snd [7];
  Integer plo_snd [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer index [7];
  Integer dims [7];
  Integer width [7];
  Integer *length;
  Integer *proc_rem_rcv;
  Integer *proc_rem_snd;
  Integer increment [7];
  Integer ndim;
  Integer *bufsize;
  Integer buftot;
  Integer buflen;
  Integer size;
  Integer handle;
  Integer np;
  Integer i;
  Integer idir;
  Integer idx;
  Integer *in_stack_fffffffffffff0c8;
  Integer *in_stack_fffffffffffff0d0;
  long in_stack_fffffffffffff0d8;
  long in_stack_fffffffffffff0e0;
  Integer *in_stack_fffffffffffff0f0;
  int local_efc;
  int local_ef8;
  int local_ef4;
  int local_eec;
  int local_ee8;
  int local_ee4;
  int local_edc;
  int local_ed8 [7];
  int local_ebc;
  int local_eb8;
  int local_eb4;
  int local_eb0;
  int local_eac;
  int local_ea8 [10];
  int local_e80;
  int local_e7c;
  long local_e78;
  long local_e70;
  long local_e68;
  long local_e60;
  long local_e58;
  long local_e50;
  long local_e48;
  long local_e40;
  long local_e38;
  long local_e30;
  long local_e28;
  long local_e20;
  long local_e18;
  long local_e10;
  long local_e08 [8];
  long local_dc8 [4];
  Integer in_stack_fffffffffffff258;
  char *in_stack_fffffffffffff260;
  long local_d90;
  long local_d80;
  long local_d78;
  int local_d6c;
  int local_d68;
  int local_d64;
  int local_d5c;
  int local_d58 [2];
  Integer in_stack_fffffffffffff2b0;
  int local_d38;
  int local_d34;
  undefined4 in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  int iVar12;
  undefined4 in_stack_fffffffffffff2d8;
  undefined4 in_stack_fffffffffffff2dc;
  Integer in_stack_fffffffffffff2e0;
  int local_cfc;
  long local_cf0;
  long local_ce0;
  long local_cd8;
  long local_cd0;
  long local_cb8;
  long local_ca8;
  long local_ca0;
  long local_c98;
  long local_c88 [8];
  long local_c48 [2];
  Integer *in_stack_fffffffffffff3c8;
  Integer *in_stack_fffffffffffff3d0;
  Integer in_stack_fffffffffffff3d8;
  Integer in_stack_fffffffffffff3e0;
  long local_c08;
  long local_bf8;
  long local_bf0;
  char local_be8 [256];
  char *local_ae8;
  int local_ae0;
  int local_adc;
  char local_ad8 [264];
  char *local_9d0;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  int local_998 [7];
  int local_97c;
  int local_978;
  int local_974;
  int local_970;
  int local_96c;
  int local_968 [10];
  int local_940;
  int local_93c;
  long local_938;
  long local_930;
  long local_928;
  long local_920;
  long local_918;
  long local_910;
  long local_908;
  long local_900;
  long local_8f8;
  long local_8f0;
  long local_8e8;
  long local_8e0;
  long local_8d8;
  long local_8d0;
  long local_8c8 [8];
  long local_888 [7];
  long local_850;
  long local_848;
  long local_840;
  long local_838;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  int local_818 [7];
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  int local_7e8 [10];
  int local_7c0;
  int local_7bc;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  long local_798;
  long local_790;
  long local_788;
  long local_780;
  long local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  Integer *in_stack_fffffffffffff8b0;
  Integer *in_stack_fffffffffffff8b8;
  Integer *in_stack_fffffffffffff8c0;
  Integer *in_stack_fffffffffffff8c8;
  Integer *in_stack_fffffffffffff8d0;
  Integer in_stack_fffffffffffff8d8;
  long local_708 [8];
  long local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  char local_6a8 [256];
  char *local_5a8;
  int local_5a0;
  int local_59c;
  char local_598 [256];
  char *local_498;
  int local_490;
  int local_48c;
  double *local_488;
  void *local_480;
  long local_478;
  Integer local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  int local_444;
  long *local_440;
  int *local_438;
  double *local_430;
  long local_428 [8];
  long alStack_3e8 [8];
  long alStack_3a8 [8];
  Integer local_368 [8];
  long local_328 [8];
  long alStack_2e8 [8];
  long alStack_2a8 [8];
  long alStack_268 [8];
  Integer aIStack_228 [8];
  long local_1e8 [8];
  long local_1a8 [16];
  Integer local_128 [8];
  Integer local_e8 [7];
  long *local_b0;
  double *local_a8;
  double *local_a0;
  long alStack_98 [7];
  long local_60;
  double *local_58;
  long local_50;
  Integer *local_48;
  long local_40;
  long local_38;
  long local_28;
  long local_20;
  long local_18;
  Integer local_10;
  logical local_8;
  
  local_38 = in_RDI + 1000;
  local_10 = in_RDI;
  local_470 = pnga_nodeid();
  local_480 = (void *)0x0;
  local_488 = (double *)0x0;
  lVar4 = pnga_has_ghosts(local_10);
  if (lVar4 == 0) {
    local_8 = 1;
  }
  else {
    lVar4 = gai_check_ghost_distr(local_10);
    if (lVar4 == 0) {
      local_8 = 0;
    }
    else {
      local_40 = (long)GA[local_38].elemsize;
      local_60 = (long)GA[local_38].ndim;
      local_478 = (long)GA[local_38].p_handle;
      width_00 = (Integer *)(local_60 << 1);
      local_444 = (int)width_00 * ((GA[local_38].ndim * 0xc + 0x28) / 8 + 1) + 1;
      pdVar5 = (double *)malloc((long)local_444 << 3);
      GA[local_38].cache = pdVar5;
      local_460 = GA[local_38].cache;
      pnga_distribution(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                        in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
      for (local_18 = 0; local_18 < local_60; local_18 = local_18 + 1) {
        alStack_98[local_18] = 0;
        local_e8[local_18] = GA[local_38].width[local_18];
        local_128[local_18] = GA[local_38].dims[local_18];
        if ((local_1a8[local_18] == 0) && (local_1e8[local_18] == -1)) {
          *local_460 = 0.0;
          return 0;
        }
      }
      local_480 = malloc((GAnproc * 0xe + 1) * 8);
      if (local_480 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
      }
      local_488 = (double *)malloc(GAnproc << 3);
      if (local_488 == (double *)0x0) {
        pnga_error(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
      }
      pnga_proc_topology(in_stack_fffffffffffff2e0,
                         CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                         (Integer *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
      local_50 = 1;
      for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
        local_50 = ((local_1e8[local_28] - local_1a8[local_28]) + 1 + local_e8[local_28] * 2) *
                   local_50;
      }
      local_48 = (Integer *)0x1;
      for (local_28 = 0; pIVar3 = local_48, local_28 < local_60; local_28 = local_28 + 1) {
        local_20 = (local_1e8[local_28] - local_1a8[local_28]) + 1;
        if ((long)local_48 < (local_50 / (local_20 + local_e8[local_28] * 2)) * local_e8[local_28])
        {
          local_48 = (Integer *)
                     ((local_50 / (local_20 + local_e8[local_28] * 2)) * local_e8[local_28]);
        }
        in_stack_fffffffffffff0f0 = pIVar3;
      }
      local_58 = local_460;
      local_468 = local_460 + 1;
      *local_460 = (double)(local_40 * (long)local_48);
      for (local_18 = 0; local_18 < local_60; local_18 = local_18 + 1) {
        if (local_e8[local_18] != 0) {
          local_450 = local_468;
          local_458 = local_468 + 1;
          local_a0 = local_468 + 2;
          local_a8 = local_468 + 3;
          local_430 = local_468 + 4;
          local_438 = (int *)((long)local_430 + local_60 * 4);
          local_b0 = (long *)(local_438 + local_60);
          local_440 = local_b0 + 1;
          local_468 = (double *)((long)local_440 + local_60 * 4);
          get_remote_block_neg
                    (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                     in_stack_fffffffffffff0c8,local_e8,local_128,in_stack_fffffffffffff0f0,width_00
                    );
          lVar4 = pnga_locate_region(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                                     in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                                     in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
          if (lVar4 == 0) {
            local_498 = "cannot locate region: ";
            sprintf(local_598,"%s","cannot locate region: ");
            local_48c = 0;
            sVar6 = strlen(local_498);
            local_490 = (int)sVar6;
            sprintf(local_598 + local_490,"%s",GA[local_10 + 1000].name);
            sVar6 = strlen(local_598);
            local_490 = (int)sVar6;
            sprintf(local_598 + (int)sVar6," [%ld:%ld ",local_328[local_48c],local_368[local_48c]);
            sVar6 = strlen(local_598);
            local_490 = (int)sVar6;
            for (local_48c = 1; lVar7 = (long)local_48c,
                IVar8 = pnga_ndim(in_stack_fffffffffffff2b0), lVar7 < IVar8;
                local_48c = local_48c + 1) {
              sprintf(local_598 + local_490,",%ld:%ld ",local_328[local_48c],local_368[local_48c]);
              sVar6 = strlen(local_598);
              local_490 = (int)sVar6;
            }
            sprintf(local_598 + local_490,"%s","]");
            sVar6 = strlen(local_598);
            local_490 = (int)sVar6;
            pnga_error(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          }
          *local_a0 = *local_488;
          if (-1 < local_478) {
            *local_a0 = (double)(long)PGRP_LIST[local_478].inv_map_proc_list[(long)*local_a0];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              alStack_2a8[local_28] = local_1e8[local_28] + 1;
              alStack_2e8[local_28] = local_1e8[local_28] + local_e8[local_28];
            }
            else {
              alStack_2a8[local_28] = local_1a8[local_28];
              alStack_2e8[local_28] = local_1e8[local_28];
            }
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              if (local_128[local_28] < alStack_2e8[local_28]) {
                local_328[local_28] = 1;
                local_368[local_28] = local_e8[local_28];
              }
              else {
                local_328[local_28] = alStack_2a8[local_28];
                local_368[local_28] = alStack_2e8[local_28];
              }
            }
            else {
              local_328[local_28] = alStack_2a8[local_28];
              local_368[local_28] = alStack_2e8[local_28];
            }
          }
          lVar4 = pnga_locate_region(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                                     in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                                     in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
          if (lVar4 == 0) {
            local_5a8 = "cannot locate region: ";
            sprintf(local_6a8,"%s","cannot locate region: ");
            local_59c = 0;
            sVar6 = strlen(local_5a8);
            local_5a0 = (int)sVar6;
            sprintf(local_6a8 + local_5a0,"%s",GA[local_10 + 1000].name);
            sVar6 = strlen(local_6a8);
            local_5a0 = (int)sVar6;
            sprintf(local_6a8 + (int)sVar6," [%ld:%ld ",local_328[local_59c],local_368[local_59c]);
            sVar6 = strlen(local_6a8);
            local_5a0 = (int)sVar6;
            local_59c = 1;
            while( true ) {
              in_stack_fffffffffffff0e0 = (long)local_59c;
              IVar8 = pnga_ndim(in_stack_fffffffffffff2b0);
              if (IVar8 <= in_stack_fffffffffffff0e0) break;
              sprintf(local_6a8 + local_5a0,",%ld:%ld ",local_328[local_59c],local_368[local_59c]);
              sVar6 = strlen(local_6a8);
              local_5a0 = (int)sVar6;
              local_59c = local_59c + 1;
            }
            sprintf(local_6a8 + local_5a0,"%s","]");
            sVar6 = strlen(local_6a8);
            local_5a0 = (int)sVar6;
            pnga_error(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          }
          *local_a8 = *local_488;
          if (-1 < local_478) {
            *local_a8 = (double)(long)PGRP_LIST[local_478].inv_map_proc_list[(long)*local_a8];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (alStack_98[local_28] == 0) {
              if (local_28 == local_18) {
                aIStack_228[local_28] = local_e8[local_28];
                alStack_268[local_28] = local_e8[local_28] * 2 + -1;
                alStack_3a8[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28] + 1;
                alStack_3e8[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28] * 2;
              }
              else {
                aIStack_228[local_28] = local_e8[local_28];
                alStack_268[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28];
                alStack_3a8[local_28] = local_e8[local_28];
                alStack_3e8[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28];
              }
            }
            else {
              alStack_3a8[local_28] = 0;
              alStack_3e8[local_28] =
                   (local_1e8[local_28] - local_1a8[local_28]) + alStack_98[local_28];
              aIStack_228[local_28] = 0;
              alStack_268[local_28] =
                   (local_1e8[local_28] - local_1a8[local_28]) + alStack_98[local_28];
            }
          }
          local_6b8 = 1;
          local_6c0 = (long)(GA[local_38].ndim + -1);
          local_6c8 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              local_770 = (long)GA[local_38].ndim;
              local_778 = 0;
              local_758 = 1;
              for (local_760 = 0; local_760 < local_770; local_760 = local_760 + 1) {
                local_758 = GA[local_38].nblock[local_760] * local_758;
              }
              if ((local_758 + -1 < local_470) || (local_470 < 0)) {
                for (local_760 = 0; local_760 < local_770; local_760 = local_760 + 1) {
                  local_708[local_760] = 0;
                  *(undefined8 *)(&stack0xfffffffffffff8b8 + local_760 * 8) = 0xffffffffffffffff;
                }
              }
              else {
                local_768 = local_470;
                for (local_760 = 0; local_760 < local_770; local_760 = local_760 + 1) {
                  in_stack_fffffffffffff8b0 =
                       (Integer *)(local_768 % (long)GA[local_38].nblock[local_760]);
                  local_768 = local_768 / (long)GA[local_38].nblock[local_760];
                  local_780 = (long)in_stack_fffffffffffff8b0 + local_778;
                  local_778 = GA[local_38].nblock[local_760] + local_778;
                  local_708[local_760] = GA[local_38].mapc[local_780];
                  if (in_stack_fffffffffffff8b0 ==
                      (Integer *)(long)(GA[local_38].nblock[local_760] + -1)) {
                    *(C_Integer *)(&stack0xfffffffffffff8b8 + local_760 * 8) =
                         GA[local_38].dims[local_760];
                  }
                  else {
                    *(C_Integer *)(&stack0xfffffffffffff8b8 + local_760 * 8) =
                         GA[local_38].mapc[local_780 + 1] + -1;
                  }
                }
              }
            }
            else if (local_470 < GA[local_38].num_rstrctd) {
              local_7a8 = (long)GA[local_38].ndim;
              local_7b0 = 0;
              local_790 = 1;
              for (local_798 = 0; local_798 < local_7a8; local_798 = local_798 + 1) {
                local_790 = GA[local_38].nblock[local_798] * local_790;
              }
              if ((local_790 + -1 < local_470) || (local_470 < 0)) {
                for (local_798 = 0; local_798 < local_7a8; local_798 = local_798 + 1) {
                  local_708[local_798] = 0;
                  *(undefined8 *)(&stack0xfffffffffffff8b8 + local_798 * 8) = 0xffffffffffffffff;
                }
              }
              else {
                local_7a0 = local_470;
                for (local_798 = 0; local_798 < local_7a8; local_798 = local_798 + 1) {
                  local_788 = local_7a0 % (long)GA[local_38].nblock[local_798];
                  local_7a0 = local_7a0 / (long)GA[local_38].nblock[local_798];
                  local_7b8 = local_788 + local_7b0;
                  local_7b0 = GA[local_38].nblock[local_798] + local_7b0;
                  local_708[local_798] = GA[local_38].mapc[local_7b8];
                  if (local_788 == GA[local_38].nblock[local_798] + -1) {
                    *(C_Integer *)(&stack0xfffffffffffff8b8 + local_798 * 8) =
                         GA[local_38].dims[local_798];
                  }
                  else {
                    *(C_Integer *)(&stack0xfffffffffffff8b8 + local_798 * 8) =
                         GA[local_38].mapc[local_7b8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_38].ndim;
              local_7c0 = (int)sVar1;
              for (local_7bc = 0; local_7bc < sVar1; local_7bc = local_7bc + 1) {
                local_708[local_7bc] = 0;
                *(undefined8 *)(&stack0xfffffffffffff8b8 + (long)local_7bc * 8) = 0xffffffffffffffff
                ;
              }
            }
          }
          else {
            iVar12 = (int)local_470;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              local_7f0 = (int)sVar1;
              sVar2 = GA[local_38].ndim;
              local_7fc = (int)sVar2;
              local_7f4 = iVar12;
              local_7e8[0] = (int)((long)iVar12 % GA[local_38].num_blocks[0]);
              for (local_7f8 = 1; local_7f8 < sVar2; local_7f8 = local_7f8 + 1) {
                local_7f4 = (int)((long)(local_7f4 - local_7e8[local_7f8 + -1]) /
                                 GA[local_38].num_blocks[local_7f8 + -1]);
                local_7e8[local_7f8] = (int)((long)local_7f4 % GA[local_38].num_blocks[local_7f8]);
              }
              for (local_7ec = 0; local_7ec < sVar1; local_7ec = local_7ec + 1) {
                local_708[local_7ec] =
                     (long)local_7e8[local_7ec] * GA[local_38].block_dims[local_7ec] + 1;
                *(long *)(&stack0xfffffffffffff8b8 + (long)local_7ec * 8) =
                     (long)(local_7e8[local_7ec] + 1) * GA[local_38].block_dims[local_7ec];
                if (GA[local_38].dims[local_7ec] <
                    *(long *)(&stack0xfffffffffffff8b8 + (long)local_7ec * 8)) {
                  *(C_Integer *)(&stack0xfffffffffffff8b8 + (long)local_7ec * 8) =
                       GA[local_38].dims[local_7ec];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_820 = (int)sVar1;
              local_824 = 0;
              sVar2 = GA[local_38].ndim;
              local_830 = (int)sVar2;
              local_828 = iVar12;
              local_818[0] = (int)((long)iVar12 % GA[local_38].num_blocks[0]);
              for (local_82c = 1; local_82c < sVar2; local_82c = local_82c + 1) {
                local_828 = (int)((long)(local_828 - local_818[local_82c + -1]) /
                                 GA[local_38].num_blocks[local_82c + -1]);
                local_818[local_82c] = (int)((long)local_828 % GA[local_38].num_blocks[local_82c]);
              }
              for (local_81c = 0; local_81c < sVar1; local_81c = local_81c + 1) {
                local_708[local_81c] = GA[local_38].mapc[local_824 + local_818[local_81c]];
                if ((long)local_818[local_81c] < GA[local_38].num_blocks[local_81c] + -1) {
                  *(C_Integer *)(&stack0xfffffffffffff8b8 + (long)local_81c * 8) =
                       GA[local_38].mapc[local_824 + local_818[local_81c] + 1] + -1;
                }
                else {
                  *(C_Integer *)(&stack0xfffffffffffff8b8 + (long)local_81c * 8) =
                       GA[local_38].dims[local_81c];
                }
                local_824 = local_824 + (int)GA[local_38].num_blocks[local_81c];
              }
            }
          }
          if (local_6c0 == 0) {
            local_428[0] = (long)in_stack_fffffffffffff8b8 +
                           GA[local_38].width[0] * 2 + (1 - local_708[0]);
          }
          for (local_6b0 = 0; local_6b0 < local_6c0; local_6b0 = local_6b0 + 1) {
            local_6c8 = aIStack_228[local_6b0] * local_6b8 + local_6c8;
            local_428[local_6b0] =
                 (*(long *)(&stack0xfffffffffffff8b8 + local_6b0 * 8) - local_708[local_6b0]) + 1 +
                 GA[local_38].width[local_6b0] * 2;
            local_6b8 = local_428[local_6b0] * local_6b8;
          }
          local_6c8 = aIStack_228[local_6c0] * local_6b8 + local_6c8;
          *local_450 = (double)(GA[local_38].ptr[local_470] + local_6c8 * GA[local_38].elemsize);
          local_840 = 1;
          local_848 = (long)(GA[local_38].ndim + -1);
          local_850 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              local_8f0 = (long)GA[local_38].ndim;
              local_8f8 = 0;
              local_8d8 = 1;
              for (local_8e0 = 0; local_8e0 < local_8f0; local_8e0 = local_8e0 + 1) {
                local_8d8 = GA[local_38].nblock[local_8e0] * local_8d8;
              }
              if ((local_8d8 + -1 < local_470) || (local_470 < 0)) {
                for (local_8e0 = 0; local_8e0 < local_8f0; local_8e0 = local_8e0 + 1) {
                  local_888[local_8e0] = 0;
                  local_8c8[local_8e0] = -1;
                }
              }
              else {
                local_8e8 = local_470;
                for (local_8e0 = 0; local_8e0 < local_8f0; local_8e0 = local_8e0 + 1) {
                  local_8d0 = local_8e8 % (long)GA[local_38].nblock[local_8e0];
                  local_8e8 = local_8e8 / (long)GA[local_38].nblock[local_8e0];
                  local_900 = local_8d0 + local_8f8;
                  local_8f8 = GA[local_38].nblock[local_8e0] + local_8f8;
                  local_888[local_8e0] = GA[local_38].mapc[local_900];
                  if (local_8d0 == GA[local_38].nblock[local_8e0] + -1) {
                    local_8c8[local_8e0] = GA[local_38].dims[local_8e0];
                  }
                  else {
                    local_8c8[local_8e0] = GA[local_38].mapc[local_900 + 1] + -1;
                  }
                }
              }
            }
            else if (local_470 < GA[local_38].num_rstrctd) {
              local_928 = (long)GA[local_38].ndim;
              local_930 = 0;
              local_910 = 1;
              for (local_918 = 0; local_918 < local_928; local_918 = local_918 + 1) {
                local_910 = GA[local_38].nblock[local_918] * local_910;
              }
              if ((local_910 + -1 < local_470) || (local_470 < 0)) {
                for (local_918 = 0; local_918 < local_928; local_918 = local_918 + 1) {
                  local_888[local_918] = 0;
                  local_8c8[local_918] = -1;
                }
              }
              else {
                local_920 = local_470;
                for (local_918 = 0; local_918 < local_928; local_918 = local_918 + 1) {
                  local_908 = local_920 % (long)GA[local_38].nblock[local_918];
                  local_920 = local_920 / (long)GA[local_38].nblock[local_918];
                  local_938 = local_908 + local_930;
                  local_930 = GA[local_38].nblock[local_918] + local_930;
                  local_888[local_918] = GA[local_38].mapc[local_938];
                  if (local_908 == GA[local_38].nblock[local_918] + -1) {
                    local_8c8[local_918] = GA[local_38].dims[local_918];
                  }
                  else {
                    local_8c8[local_918] = GA[local_38].mapc[local_938 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_38].ndim;
              local_940 = (int)sVar1;
              for (local_93c = 0; local_93c < sVar1; local_93c = local_93c + 1) {
                local_888[local_93c] = 0;
                local_8c8[local_93c] = -1;
              }
            }
          }
          else {
            iVar12 = (int)local_470;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              local_970 = (int)sVar1;
              sVar2 = GA[local_38].ndim;
              local_97c = (int)sVar2;
              local_974 = iVar12;
              local_968[0] = (int)((long)iVar12 % GA[local_38].num_blocks[0]);
              for (local_978 = 1; local_978 < sVar2; local_978 = local_978 + 1) {
                local_974 = (int)((long)(local_974 - local_968[local_978 + -1]) /
                                 GA[local_38].num_blocks[local_978 + -1]);
                local_968[local_978] = (int)((long)local_974 % GA[local_38].num_blocks[local_978]);
              }
              for (local_96c = 0; local_96c < sVar1; local_96c = local_96c + 1) {
                local_888[local_96c] =
                     (long)local_968[local_96c] * GA[local_38].block_dims[local_96c] + 1;
                local_8c8[local_96c] =
                     (long)(local_968[local_96c] + 1) * GA[local_38].block_dims[local_96c];
                if (GA[local_38].dims[local_96c] < local_8c8[local_96c]) {
                  local_8c8[local_96c] = GA[local_38].dims[local_96c];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_9a0 = (int)sVar1;
              local_9a4 = 0;
              sVar2 = GA[local_38].ndim;
              local_9b0 = (int)sVar2;
              local_9a8 = iVar12;
              local_998[0] = (int)((long)iVar12 % GA[local_38].num_blocks[0]);
              for (local_9ac = 1; local_9ac < sVar2; local_9ac = local_9ac + 1) {
                local_9a8 = (int)((long)(local_9a8 - local_998[local_9ac + -1]) /
                                 GA[local_38].num_blocks[local_9ac + -1]);
                local_998[local_9ac] = (int)((long)local_9a8 % GA[local_38].num_blocks[local_9ac]);
              }
              for (local_99c = 0; local_99c < sVar1; local_99c = local_99c + 1) {
                local_888[local_99c] = GA[local_38].mapc[local_9a4 + local_998[local_99c]];
                if ((long)local_998[local_99c] < GA[local_38].num_blocks[local_99c] + -1) {
                  local_8c8[local_99c] =
                       GA[local_38].mapc[local_9a4 + local_998[local_99c] + 1] + -1;
                }
                else {
                  local_8c8[local_99c] = GA[local_38].dims[local_99c];
                }
                local_9a4 = local_9a4 + (int)GA[local_38].num_blocks[local_99c];
              }
            }
          }
          if (local_848 == 0) {
            local_428[0] = (local_8c8[0] - local_888[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_838 = 0; local_838 < local_848; local_838 = local_838 + 1) {
            local_850 = alStack_3a8[local_838] * local_840 + local_850;
            local_428[local_838] =
                 (local_8c8[local_838] - local_888[local_838]) + 1 +
                 GA[local_38].width[local_838] * 2;
            local_840 = local_428[local_838] * local_840;
          }
          local_850 = alStack_3a8[local_848] * local_840 + local_850;
          *local_458 = (double)(GA[local_38].ptr[local_470] + local_850 * GA[local_38].elemsize);
          iVar12 = (int)local_40;
          *(int *)local_430 = iVar12;
          *local_438 = iVar12;
          for (local_9b4 = 0; (long)local_9b4 < local_60 + -1; local_9b4 = local_9b4 + 1) {
            local_438[local_9b4] = (int)local_428[local_9b4] * local_438[local_9b4];
            *(int *)((long)local_430 + (long)local_9b4 * 4) =
                 (int)local_428[local_9b4] * *(int *)((long)local_430 + (long)local_9b4 * 4);
            local_438[local_9b4 + 1] = local_438[local_9b4];
            *(int *)((long)local_430 + (long)(local_9b4 + 1) * 4) =
                 *(int *)((long)local_430 + (long)local_9b4 * 4);
          }
          for (local_9b8 = 0; local_9b8 < local_60; local_9b8 = local_9b8 + 1) {
            *(int *)((long)local_440 + (long)local_9b8 * 4) =
                 ((int)alStack_3e8[local_9b8] - (int)alStack_3a8[local_9b8]) + 1;
          }
          local_9bc = 0;
          *local_b0 = 1;
          for (; local_9bc < local_60; local_9bc = local_9bc + 1) {
            *local_b0 = ((alStack_268[local_9bc] - aIStack_228[local_9bc]) + 1) * *local_b0;
          }
          *local_b0 = local_40 * *local_b0;
          *(int *)local_440 = (int)*local_440 * iVar12;
          local_450 = local_468;
          local_458 = (double *)((long)local_468 + 8);
          local_a0 = (double *)((long)local_468 + 0x10);
          local_a8 = (double *)((long)local_468 + 0x18);
          local_430 = (double *)((long)local_468 + 0x20);
          local_438 = (int *)((long)local_430 + local_60 * 4);
          local_b0 = (long *)(local_438 + local_60);
          local_440 = local_b0 + 1;
          local_468 = (double *)((long)local_440 + local_60 * 4);
          get_remote_block_pos
                    (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                     in_stack_fffffffffffff0c8,local_e8,local_128,in_stack_fffffffffffff0f0,width_00
                    );
          lVar4 = pnga_locate_region(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                                     in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                                     in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
          if (lVar4 == 0) {
            local_9d0 = "cannot locate region: ";
            sprintf(local_ad8,"%s","cannot locate region: ");
            local_9c0 = 0;
            sVar6 = strlen(local_9d0);
            local_9c4 = (int)sVar6;
            sprintf(local_ad8 + local_9c4,"%s",GA[local_10 + 1000].name);
            sVar6 = strlen(local_ad8);
            local_9c4 = (int)sVar6;
            sprintf(local_ad8 + (int)sVar6," [%ld:%ld ",local_328[local_9c0],local_368[local_9c0]);
            sVar6 = strlen(local_ad8);
            local_9c4 = (int)sVar6;
            local_9c0 = 1;
            while( true ) {
              in_stack_fffffffffffff0d8 = (long)local_9c0;
              IVar8 = pnga_ndim(in_stack_fffffffffffff2b0);
              if (IVar8 <= in_stack_fffffffffffff0d8) break;
              sprintf(local_ad8 + local_9c4,",%ld:%ld ",local_328[local_9c0],local_368[local_9c0]);
              sVar6 = strlen(local_ad8);
              local_9c4 = (int)sVar6;
              local_9c0 = local_9c0 + 1;
            }
            sprintf(local_ad8 + local_9c4,"%s","]");
            sVar6 = strlen(local_ad8);
            local_9c4 = (int)sVar6;
            pnga_error(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          }
          *local_a0 = *local_488;
          if (-1 < local_478) {
            *local_a0 = (double)(long)PGRP_LIST[local_478].inv_map_proc_list[(long)*local_a0];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              alStack_2a8[local_28] = local_1a8[local_28] - local_e8[local_28];
              alStack_2e8[local_28] = local_1a8[local_28] + -1;
            }
            else {
              alStack_2a8[local_28] = local_1a8[local_28];
              alStack_2e8[local_28] = local_1e8[local_28];
            }
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              if (alStack_2e8[local_28] < 1) {
                local_328[local_28] = (local_128[local_28] - local_e8[local_28]) + 1;
                local_368[local_28] = local_128[local_28];
              }
              else {
                local_328[local_28] = alStack_2a8[local_28];
                local_368[local_28] = alStack_2e8[local_28];
              }
            }
            else {
              local_328[local_28] = alStack_2a8[local_28];
              local_368[local_28] = alStack_2e8[local_28];
            }
          }
          lVar4 = pnga_locate_region(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                                     in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                                     in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
          if (lVar4 == 0) {
            local_ae8 = "cannot locate region: ";
            sprintf(local_be8,"%s","cannot locate region: ");
            local_adc = 0;
            sVar6 = strlen(local_ae8);
            local_ae0 = (int)sVar6;
            sprintf(local_be8 + local_ae0,"%s",GA[local_10 + 1000].name);
            sVar6 = strlen(local_be8);
            local_ae0 = (int)sVar6;
            sprintf(local_be8 + (int)sVar6," [%ld:%ld ",local_328[local_adc],local_368[local_adc]);
            sVar6 = strlen(local_be8);
            local_ae0 = (int)sVar6;
            local_adc = 1;
            while( true ) {
              in_stack_fffffffffffff0d0 = (Integer *)(long)local_adc;
              IVar8 = pnga_ndim(in_stack_fffffffffffff2b0);
              if (IVar8 <= (long)in_stack_fffffffffffff0d0) break;
              sprintf(local_be8 + local_ae0,",%ld:%ld ",local_328[local_adc],local_368[local_adc]);
              sVar6 = strlen(local_be8);
              local_ae0 = (int)sVar6;
              local_adc = local_adc + 1;
            }
            sprintf(local_be8 + local_ae0,"%s","]");
            sVar6 = strlen(local_be8);
            local_ae0 = (int)sVar6;
            pnga_error(in_stack_fffffffffffff260,in_stack_fffffffffffff258);
          }
          *local_a8 = *local_488;
          if (-1 < local_478) {
            *local_a8 = (double)(long)PGRP_LIST[local_478].inv_map_proc_list[(long)*local_a8];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (alStack_98[local_28] == 0) {
              if (local_28 == local_18) {
                aIStack_228[local_28] = (local_1e8[local_28] - local_1a8[local_28]) + 1;
                alStack_268[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28];
                alStack_3a8[local_28] = 0;
                alStack_3e8[local_28] = local_e8[local_28] + -1;
              }
              else {
                aIStack_228[local_28] = local_e8[local_28];
                alStack_268[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28];
                alStack_3a8[local_28] = local_e8[local_28];
                alStack_3e8[local_28] =
                     (local_1e8[local_28] - local_1a8[local_28]) + local_e8[local_28];
              }
            }
            else {
              alStack_3a8[local_28] = 0;
              alStack_3e8[local_28] =
                   (local_1e8[local_28] - local_1a8[local_28]) + alStack_98[local_28];
              aIStack_228[local_28] = 0;
              alStack_268[local_28] =
                   (local_1e8[local_28] - local_1a8[local_28]) + alStack_98[local_28];
            }
          }
          local_bf8 = 1;
          lVar7 = (long)(GA[local_38].ndim + -1);
          local_c08 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              lVar9 = (long)GA[local_38].ndim;
              local_cb8 = 0;
              local_c98 = 1;
              for (local_ca0 = 0; local_ca0 < lVar9; local_ca0 = local_ca0 + 1) {
                local_c98 = GA[local_38].nblock[local_ca0] * local_c98;
              }
              if ((local_c98 + -1 < local_470) || (local_470 < 0)) {
                for (local_ca0 = 0; local_ca0 < lVar9; local_ca0 = local_ca0 + 1) {
                  local_c48[local_ca0] = 0;
                  local_c88[local_ca0] = -1;
                }
              }
              else {
                local_ca8 = local_470;
                for (local_ca0 = 0; local_ca0 < lVar9; local_ca0 = local_ca0 + 1) {
                  lVar11 = local_ca8 % (long)GA[local_38].nblock[local_ca0];
                  local_ca8 = local_ca8 / (long)GA[local_38].nblock[local_ca0];
                  lVar10 = lVar11 + local_cb8;
                  local_cb8 = GA[local_38].nblock[local_ca0] + local_cb8;
                  local_c48[local_ca0] = GA[local_38].mapc[lVar10];
                  if (lVar11 == GA[local_38].nblock[local_ca0] + -1) {
                    local_c88[local_ca0] = GA[local_38].dims[local_ca0];
                  }
                  else {
                    local_c88[local_ca0] = GA[local_38].mapc[lVar10 + 1] + -1;
                  }
                }
              }
            }
            else if (local_470 < GA[local_38].num_rstrctd) {
              lVar9 = (long)GA[local_38].ndim;
              local_cf0 = 0;
              local_cd0 = 1;
              for (local_cd8 = 0; local_cd8 < lVar9; local_cd8 = local_cd8 + 1) {
                local_cd0 = GA[local_38].nblock[local_cd8] * local_cd0;
              }
              if ((local_cd0 + -1 < local_470) || (local_470 < 0)) {
                for (local_cd8 = 0; local_cd8 < lVar9; local_cd8 = local_cd8 + 1) {
                  local_c48[local_cd8] = 0;
                  local_c88[local_cd8] = -1;
                }
              }
              else {
                local_ce0 = local_470;
                for (local_cd8 = 0; local_cd8 < lVar9; local_cd8 = local_cd8 + 1) {
                  lVar11 = local_ce0 % (long)GA[local_38].nblock[local_cd8];
                  local_ce0 = local_ce0 / (long)GA[local_38].nblock[local_cd8];
                  lVar10 = lVar11 + local_cf0;
                  local_cf0 = GA[local_38].nblock[local_cd8] + local_cf0;
                  local_c48[local_cd8] = GA[local_38].mapc[lVar10];
                  if (lVar11 == GA[local_38].nblock[local_cd8] + -1) {
                    local_c88[local_cd8] = GA[local_38].dims[local_cd8];
                  }
                  else {
                    local_c88[local_cd8] = GA[local_38].mapc[lVar10 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_38].ndim;
              for (local_cfc = 0; local_cfc < sVar1; local_cfc = local_cfc + 1) {
                local_c48[local_cfc] = 0;
                local_c88[local_cfc] = -1;
              }
            }
          }
          else {
            local_d68 = (int)local_470;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              sVar2 = GA[local_38].ndim;
              local_d34 = local_d68;
              for (local_d38 = 1; local_d38 < sVar2; local_d38 = local_d38 + 1) {
                local_d34 = (int)((long)(local_d34 -
                                        *(int *)(&stack0xfffffffffffff2d8 +
                                                (long)(local_d38 + -1) * 4)) /
                                 GA[local_38].num_blocks[local_d38 + -1]);
                *(int *)(&stack0xfffffffffffff2d8 + (long)local_d38 * 4) =
                     (int)((long)local_d34 % GA[local_38].num_blocks[local_d38]);
              }
              for (iVar12 = 0; iVar12 < sVar1; iVar12 = iVar12 + 1) {
                local_c48[iVar12] =
                     (long)*(int *)(&stack0xfffffffffffff2d8 + (long)iVar12 * 4) *
                     GA[local_38].block_dims[iVar12] + 1;
                local_c88[iVar12] =
                     (long)(*(int *)(&stack0xfffffffffffff2d8 + (long)iVar12 * 4) + 1) *
                     GA[local_38].block_dims[iVar12];
                if (GA[local_38].dims[iVar12] < local_c88[iVar12]) {
                  local_c88[iVar12] = GA[local_38].dims[iVar12];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_d64 = 0;
              sVar2 = GA[local_38].ndim;
              local_d58[0] = (int)((long)local_d68 % GA[local_38].num_blocks[0]);
              for (local_d6c = 1; local_d6c < sVar2; local_d6c = local_d6c + 1) {
                local_d68 = (int)((long)(local_d68 - local_d58[local_d6c + -1]) /
                                 GA[local_38].num_blocks[local_d6c + -1]);
                local_d58[local_d6c] = (int)((long)local_d68 % GA[local_38].num_blocks[local_d6c]);
              }
              for (local_d5c = 0; local_d5c < sVar1; local_d5c = local_d5c + 1) {
                local_c48[local_d5c] = GA[local_38].mapc[local_d64 + local_d58[local_d5c]];
                if ((long)local_d58[local_d5c] < GA[local_38].num_blocks[local_d5c] + -1) {
                  local_c88[local_d5c] =
                       GA[local_38].mapc[local_d64 + local_d58[local_d5c] + 1] + -1;
                }
                else {
                  local_c88[local_d5c] = GA[local_38].dims[local_d5c];
                }
                local_d64 = local_d64 + (int)GA[local_38].num_blocks[local_d5c];
              }
            }
          }
          if (lVar7 == 0) {
            local_428[0] = (local_c88[0] - local_c48[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_bf0 = 0; local_bf0 < lVar7; local_bf0 = local_bf0 + 1) {
            local_c08 = aIStack_228[local_bf0] * local_bf8 + local_c08;
            local_428[local_bf0] =
                 (local_c88[local_bf0] - local_c48[local_bf0]) + 1 +
                 GA[local_38].width[local_bf0] * 2;
            local_bf8 = local_428[local_bf0] * local_bf8;
          }
          *local_450 = (double)(GA[local_38].ptr[local_470] +
                               (aIStack_228[lVar7] * local_bf8 + local_c08) *
                               (long)GA[local_38].elemsize);
          local_d80 = 1;
          lVar7 = (long)(GA[local_38].ndim + -1);
          local_d90 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              local_e30 = (long)GA[local_38].ndim;
              local_e38 = 0;
              local_e18 = 1;
              for (local_e20 = 0; local_e20 < local_e30; local_e20 = local_e20 + 1) {
                local_e18 = GA[local_38].nblock[local_e20] * local_e18;
              }
              if ((local_e18 + -1 < local_470) || (local_470 < 0)) {
                for (local_e20 = 0; local_e20 < local_e30; local_e20 = local_e20 + 1) {
                  local_dc8[local_e20] = 0;
                  local_e08[local_e20] = -1;
                }
              }
              else {
                local_e28 = local_470;
                for (local_e20 = 0; local_e20 < local_e30; local_e20 = local_e20 + 1) {
                  local_e10 = local_e28 % (long)GA[local_38].nblock[local_e20];
                  local_e28 = local_e28 / (long)GA[local_38].nblock[local_e20];
                  local_e40 = local_e10 + local_e38;
                  local_e38 = GA[local_38].nblock[local_e20] + local_e38;
                  local_dc8[local_e20] = GA[local_38].mapc[local_e40];
                  if (local_e10 == GA[local_38].nblock[local_e20] + -1) {
                    local_e08[local_e20] = GA[local_38].dims[local_e20];
                  }
                  else {
                    local_e08[local_e20] = GA[local_38].mapc[local_e40 + 1] + -1;
                  }
                }
              }
            }
            else if (local_470 < GA[local_38].num_rstrctd) {
              local_e68 = (long)GA[local_38].ndim;
              local_e70 = 0;
              local_e50 = 1;
              for (local_e58 = 0; local_e58 < local_e68; local_e58 = local_e58 + 1) {
                local_e50 = GA[local_38].nblock[local_e58] * local_e50;
              }
              if ((local_e50 + -1 < local_470) || (local_470 < 0)) {
                for (local_e58 = 0; local_e58 < local_e68; local_e58 = local_e58 + 1) {
                  local_dc8[local_e58] = 0;
                  local_e08[local_e58] = -1;
                }
              }
              else {
                local_e60 = local_470;
                for (local_e58 = 0; local_e58 < local_e68; local_e58 = local_e58 + 1) {
                  local_e48 = local_e60 % (long)GA[local_38].nblock[local_e58];
                  local_e60 = local_e60 / (long)GA[local_38].nblock[local_e58];
                  local_e78 = local_e48 + local_e70;
                  local_e70 = GA[local_38].nblock[local_e58] + local_e70;
                  local_dc8[local_e58] = GA[local_38].mapc[local_e78];
                  if (local_e48 == GA[local_38].nblock[local_e58] + -1) {
                    local_e08[local_e58] = GA[local_38].dims[local_e58];
                  }
                  else {
                    local_e08[local_e58] = GA[local_38].mapc[local_e78 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[local_38].ndim;
              local_e80 = (int)sVar1;
              for (local_e7c = 0; local_e7c < sVar1; local_e7c = local_e7c + 1) {
                local_dc8[local_e7c] = 0;
                local_e08[local_e7c] = -1;
              }
            }
          }
          else {
            local_ee8 = (int)local_470;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              local_eb0 = (int)sVar1;
              sVar2 = GA[local_38].ndim;
              local_ebc = (int)sVar2;
              local_eb4 = local_ee8;
              local_ea8[0] = (int)((long)local_ee8 % GA[local_38].num_blocks[0]);
              for (local_eb8 = 1; local_eb8 < sVar2; local_eb8 = local_eb8 + 1) {
                local_eb4 = (int)((long)(local_eb4 - local_ea8[local_eb8 + -1]) /
                                 GA[local_38].num_blocks[local_eb8 + -1]);
                local_ea8[local_eb8] = (int)((long)local_eb4 % GA[local_38].num_blocks[local_eb8]);
              }
              for (local_eac = 0; local_eac < sVar1; local_eac = local_eac + 1) {
                local_dc8[local_eac] =
                     (long)local_ea8[local_eac] * GA[local_38].block_dims[local_eac] + 1;
                local_e08[local_eac] =
                     (long)(local_ea8[local_eac] + 1) * GA[local_38].block_dims[local_eac];
                if (GA[local_38].dims[local_eac] < local_e08[local_eac]) {
                  local_e08[local_eac] = GA[local_38].dims[local_eac];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_ee4 = 0;
              sVar2 = GA[local_38].ndim;
              local_ed8[0] = (int)((long)local_ee8 % GA[local_38].num_blocks[0]);
              for (local_eec = 1; local_eec < sVar2; local_eec = local_eec + 1) {
                local_ee8 = (int)((long)(local_ee8 - local_ed8[local_eec + -1]) /
                                 GA[local_38].num_blocks[local_eec + -1]);
                local_ed8[local_eec] = (int)((long)local_ee8 % GA[local_38].num_blocks[local_eec]);
              }
              for (local_edc = 0; local_edc < sVar1; local_edc = local_edc + 1) {
                local_dc8[local_edc] = GA[local_38].mapc[local_ee4 + local_ed8[local_edc]];
                if ((long)local_ed8[local_edc] < GA[local_38].num_blocks[local_edc] + -1) {
                  local_e08[local_edc] =
                       GA[local_38].mapc[local_ee4 + local_ed8[local_edc] + 1] + -1;
                }
                else {
                  local_e08[local_edc] = GA[local_38].dims[local_edc];
                }
                local_ee4 = local_ee4 + (int)GA[local_38].num_blocks[local_edc];
              }
            }
          }
          if (lVar7 == 0) {
            local_428[0] = (local_e08[0] - local_dc8[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_d78 = 0; local_d78 < lVar7; local_d78 = local_d78 + 1) {
            local_d90 = alStack_3a8[local_d78] * local_d80 + local_d90;
            local_428[local_d78] =
                 (local_e08[local_d78] - local_dc8[local_d78]) + 1 +
                 GA[local_38].width[local_d78] * 2;
            local_d80 = local_428[local_d78] * local_d80;
          }
          *local_458 = (double)(GA[local_38].ptr[local_470] +
                               (alStack_3a8[lVar7] * local_d80 + local_d90) *
                               (long)GA[local_38].elemsize);
          iVar12 = (int)local_40;
          *(int *)local_430 = iVar12;
          *local_438 = iVar12;
          for (local_ef4 = 0; (long)local_ef4 < local_60 + -1; local_ef4 = local_ef4 + 1) {
            local_438[local_ef4] = (int)local_428[local_ef4] * local_438[local_ef4];
            *(int *)((long)local_430 + (long)local_ef4 * 4) =
                 (int)local_428[local_ef4] * *(int *)((long)local_430 + (long)local_ef4 * 4);
            local_438[local_ef4 + 1] = local_438[local_ef4];
            *(int *)((long)local_430 + (long)(local_ef4 + 1) * 4) =
                 *(int *)((long)local_430 + (long)local_ef4 * 4);
          }
          for (local_ef8 = 0; local_ef8 < local_60; local_ef8 = local_ef8 + 1) {
            *(int *)((long)local_440 + (long)local_ef8 * 4) =
                 ((int)alStack_3e8[local_ef8] - (int)alStack_3a8[local_ef8]) + 1;
          }
          local_efc = 0;
          *local_b0 = 1;
          for (; local_efc < local_60; local_efc = local_efc + 1) {
            *local_b0 = ((alStack_268[local_efc] - aIStack_228[local_efc]) + 1) * *local_b0;
          }
          *local_b0 = local_40 * *local_b0;
          *(int *)local_440 = (int)*local_440 * iVar12;
        }
        if (GA[local_38].corner_flag != 0) {
          alStack_98[local_18] = local_e8[local_18] << 1;
        }
      }
      free(local_480);
      free(local_488);
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_set_update4_info(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, *bufsize, ndim, increment[MAXDIM];
  Integer *proc_rem_snd, *proc_rem_rcv;
  Integer *length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int *stride_snd, *stride_rcv, *count, cache_size;
  /*int corner_flag;*/
  char **ptr_snd, **ptr_rcv, *cache;
  char *current;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets the arrays that are used to transfer data using
   * the update4. To perform the update, this routine makes use of several
   * copies of indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  cache_size = 2*sizeof(char *)+3*ndim*sizeof(int)+3*sizeof(Integer);
  cache_size = 2* ndim *((cache_size/8) + 1) + 1;
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  /*corner_flag = GA[handle].corner_flag;*/
#if GHOST_PRINT
      printf("p[%d]a cache_size: %d\n",GAme,cache_size);
#endif

  /* initialize range increments and get array dimensions */

  pnga_distribution(g_a,me,lo_loc,hi_loc);
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) {
      *(char**)cache = NULL;
      return FALSE;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update4_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update4_info:malloc failed (_ga_proclist)",0);

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = (Integer*)cache;
#if GHOST_PRINT
      printf("p[%d]a initial pointer: %d\n",GAme,(Integer)bufsize);
      fflush(stdout);
#endif
  current = (char*)(bufsize+1);

  *bufsize = size*buflen;
#if GHOST_PRINT
      printf("p[%d]a buflen: %d size: %d bufsize: %d\n",GAme,buflen,size,*bufsize);
      fflush(stdout);
#endif

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;

#if GHOST_PRINT
      printf("p[%d]a 1: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      *proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        *proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)*ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d]a 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)*ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, length);
      *length *= size;
      count[0] *= size;
#if GHOST_PRINT
      printf("p[%d]a 2: length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, *length, *bufsize, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d]a 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]a 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]a 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]a 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      fflush(stdout);
#endif

    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }
#if GHOST_PRINT
      printf("p[%d]a final pointer: %d\n",GAme,(Integer)(Integer*)current);
      fflush(stdout);
#endif
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}